

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

ScenarioLowerBound * __thiscall
despot::POMDPX::CreateScenarioLowerBound(POMDPX *this,string *name,string *particle_bound_name)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  ModeStatePolicy *this_00;
  undefined4 extraout_var;
  ScenarioLowerBound *this_01;
  undefined4 extraout_var_00;
  POMCPScenarioLowerBound *this_02;
  POMCPPrior *prior;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar4;
  long *plVar5;
  long *plVar6;
  DSPOMDP *pDVar7;
  string local_130;
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if ((this->is_small_ == false) &&
     ((iVar2 = std::__cxx11::string::compare((char *)name), iVar2 == 0 ||
      (iVar2 = std::__cxx11::string::compare((char *)name), iVar2 == 0)))) {
    this_01 = (ScenarioLowerBound *)operator_new(0x10);
    TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)this_01,&this->super_DSPOMDP);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)name);
    if ((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)name), iVar2 != 0)) {
      iVar2 = std::__cxx11::string::compare((char *)name);
      if (iVar2 == 0) {
        this_00 = (ModeStatePolicy *)operator_new(0x38);
        plVar6 = local_40;
        pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
        local_50[0] = plVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
        pDVar7 = &this->super_DSPOMDP;
        iVar2 = (*pDVar7->_vptr_DSPOMDP[0xe])(pDVar7,local_50);
        RandomPolicy::RandomPolicy
                  ((RandomPolicy *)this_00,pDVar7,
                   (ParticleLowerBound *)CONCAT44(extraout_var_00,iVar2));
        plVar5 = local_50[0];
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 == 0) {
          this_02 = (POMCPScenarioLowerBound *)operator_new(0x20);
          prior = (POMCPPrior *)operator_new(0x78);
          UniformPOMCPPrior::UniformPOMCPPrior((UniformPOMCPPrior *)prior,&this->super_DSPOMDP);
          POMCPScenarioLowerBound::POMCPScenarioLowerBound
                    (this_02,&this->super_DSPOMDP,prior,(Belief *)0x0);
          return &this_02->super_ScenarioLowerBound;
        }
        iVar2 = std::__cxx11::string::compare((char *)name);
        if (iVar2 == 0) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MDP","");
          ComputeDefaultActions(this,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          this_00 = (ModeStatePolicy *)operator_new(0x28);
          plVar6 = local_80;
          pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
          local_90[0] = plVar6;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
          pDVar7 = &this->super_DSPOMDP;
          iVar2 = (*pDVar7->_vptr_DSPOMDP[0xe])(pDVar7,local_90);
          MajorityActionPolicy::MajorityActionPolicy
                    ((MajorityActionPolicy *)this_00,pDVar7,&this->super_StatePolicy,
                     (ParticleLowerBound *)CONCAT44(extraout_var_01,iVar2));
          plVar5 = local_90[0];
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)name);
          if (iVar2 == 0) {
            this_00 = (ModeStatePolicy *)operator_new(0x28);
            plVar6 = local_a0;
            pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
            local_b0[0] = plVar6;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_b0,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
            pDVar7 = &this->super_DSPOMDP;
            iVar2 = (*pDVar7->_vptr_DSPOMDP[0xe])(pDVar7,local_b0);
            DefaultPolicy::DefaultPolicy
                      ((DefaultPolicy *)this_00,pDVar7,
                       (ParticleLowerBound *)CONCAT44(extraout_var_02,iVar2));
            (this_00->super_DefaultPolicy).super_ScenarioLowerBound._vptr_ScenarioLowerBound =
                 (_func_int **)&PTR__DefaultPolicy_0018fe78;
            (((vector<double,_std::allocator<double>_> *)&this_00->indexer_)->
            super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
            _M_start = (pointer)this;
            plVar5 = local_b0[0];
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)name);
            if (iVar2 == 0) {
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"MDP","");
              ComputeDefaultActions(this,&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
              this_00 = (ModeStatePolicy *)operator_new(0x48);
              plVar6 = local_e0;
              pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
              local_f0[0] = plVar6;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_f0,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
              pDVar7 = &this->super_DSPOMDP;
              iVar2 = (*pDVar7->_vptr_DSPOMDP[0xe])(pDVar7,local_f0);
              ModeStatePolicy::ModeStatePolicy
                        (this_00,pDVar7,&this->super_StateIndexer,&this->super_StatePolicy,
                         (ParticleLowerBound *)CONCAT44(extraout_var_03,iVar2));
              plVar5 = local_f0[0];
            }
            else {
              std::__cxx11::string::substr((ulong)&local_130,(ulong)name);
              iVar2 = std::__cxx11::string::compare((char *)&local_130);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              if (iVar2 != 0) {
                poVar4 = std::operator<<((ostream *)&std::cerr,"Unsupported scenario lower bound: ")
                ;
                poVar4 = std::operator<<(poVar4,(string *)name);
                std::endl<char,std::char_traits<char>>(poVar4);
                exit(1);
              }
              std::__cxx11::string::substr((ulong)&local_130,(ulong)name);
              iVar2 = std::__cxx11::stoi(&local_130,(size_t *)0x0,10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != &local_130.field_2) {
                operator_delete(local_130._M_dataplus._M_p,
                                local_130.field_2._M_allocated_capacity + 1);
              }
              this_00 = (ModeStatePolicy *)operator_new(0x28);
              plVar6 = local_100;
              pcVar1 = (particle_bound_name->_M_dataplus)._M_p;
              local_110[0] = plVar6;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_110,pcVar1,pcVar1 + particle_bound_name->_M_string_length);
              pDVar7 = &this->super_DSPOMDP;
              iVar3 = (*pDVar7->_vptr_DSPOMDP[0xe])(pDVar7,local_110);
              BlindPolicy::BlindPolicy
                        ((BlindPolicy *)this_00,pDVar7,iVar2,
                         (ParticleLowerBound *)CONCAT44(extraout_var,iVar3));
              plVar5 = local_110[0];
            }
          }
        }
      }
      if (plVar5 == plVar6) {
        return (ScenarioLowerBound *)this_00;
      }
      operator_delete(plVar5,*plVar6 + 1);
      return (ScenarioLowerBound *)this_00;
    }
    this_01 = (ScenarioLowerBound *)operator_new(0x10);
    TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)this_01,&this->super_DSPOMDP);
  }
  return this_01;
}

Assistant:

ScenarioLowerBound* POMDPX::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	if (!is_small_ && (name == "MAJORITY" || name == "MODE")) {
		return new TrivialParticleLowerBound(this);
	}

	const StatePolicy* policy = this;
	const StateIndexer* indexer = this;

	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "POMCP") {
		return new POMCPScenarioLowerBound(this, new UniformPOMCPPrior(this));
	} else if (name == "MAJORITY") {
		ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(this, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "GREEDY") {
		return new POMDPXGreedyActionPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE") {
		ComputeDefaultActions("MDP");
		return new ModeStatePolicy(this, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name.substr(0, 5) == "BLIND") { 
		int action = stoi(name.substr(5)); 
		return new BlindPolicy(this, action, 
				CreateParticleLowerBound(particle_bound_name)); 
	} else {
		cerr << "Unsupported scenario lower bound: " << name << endl;
		exit(1);
		return NULL;
	}
}